

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O3

string * __thiscall
cmExportInstallFileGenerator::GetCxxModulesDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmExportInstallFileGenerator *this)

{
  cmInstallExportGenerator *pcVar1;
  pointer pcVar2;
  
  pcVar1 = this->IEGen;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pcVar1->CxxModulesDirectory)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,
             pcVar2 + (pcVar1->CxxModulesDirectory)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportInstallFileGenerator::GetCxxModulesDirectory() const
{
  return IEGen->GetCxxModuleDirectory();
}